

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper.cpp
# Opt level: O2

bool wallet::feebumper::TransactionCanBeBumped(CWallet *wallet,uint256 *txid)

{
  long lVar1;
  Result RVar2;
  CWalletTx *wtx;
  long in_FS_OFFSET;
  bool bVar3;
  vector<bilingual_str,_std::allocator<bilingual_str>_> errors_dummy;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&wallet->cs_wallet,"wallet.cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/feebumper.cpp"
             ,0x9c,false);
  wtx = CWallet::GetWalletTx(wallet,txid);
  if (wtx == (CWalletTx *)0x0) {
    bVar3 = false;
  }
  else {
    errors_dummy.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    errors_dummy.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    errors_dummy.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RVar2 = PreconditionChecks(wallet,wtx,true,&errors_dummy);
    bVar3 = RVar2 == OK;
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&errors_dummy);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool TransactionCanBeBumped(const CWallet& wallet, const uint256& txid)
{
    LOCK(wallet.cs_wallet);
    const CWalletTx* wtx = wallet.GetWalletTx(txid);
    if (wtx == nullptr) return false;

    std::vector<bilingual_str> errors_dummy;
    feebumper::Result res = PreconditionChecks(wallet, *wtx, /* require_mine=*/ true, errors_dummy);
    return res == feebumper::Result::OK;
}